

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real-time-logger-def.h
# Opt level: O1

ssize_t __thiscall
dynamicgraph::LoggerIOStream::write(LoggerIOStream *this,int __fd,void *__buf,size_t __n)

{
  size_t sVar1;
  ostream *poVar2;
  ssize_t sVar3;
  undefined4 in_register_00000034;
  char *__s;
  
  __s = (char *)CONCAT44(in_register_00000034,__fd);
  poVar2 = this->os_;
  if (__s != (char *)0x0) {
    sVar1 = strlen(__s);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar1);
    return (ssize_t)poVar2;
  }
  sVar3 = std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
  return sVar3;
}

Assistant:

virtual void write(const char *c) { os_ << c; }